

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosYAML.cpp
# Opt level: O1

void adios2::helper::ParseConfigYAMLIO
               (ADIOS *adios,string *configFileYAML,string *configFileContents,IO *io)

{
  Node *pNVar1;
  pointer pcVar2;
  node *pnVar3;
  int iVar4;
  long *plVar5;
  size_type *psVar6;
  _Hash_node_base *p_Var7;
  value vVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  ADIOS *adios_00;
  size_type sVar10;
  node **ppnVar11;
  bool bVar12;
  const_iterator itNode;
  string ioName;
  string hint;
  Node ioScalar;
  string configFileContentsCopy;
  Node document;
  _Alloc_hider local_278;
  SeqIter SStack_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  element_type *local_258;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_250;
  IO *local_240;
  string local_238;
  _Rb_tree_node_base *local_218;
  string local_210;
  Node local_1f0;
  string local_1b0;
  Node local_190;
  undefined1 local_150 [24];
  node *apnStack_138 [3];
  __node_base local_120;
  undefined1 *local_108;
  undefined1 local_f8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  _Rb_tree_node_base *local_c8;
  _Rb_tree_node_base local_b8;
  undefined1 local_90 [32];
  __node_base local_70;
  size_type local_68;
  _Hash_node_base local_60;
  size_t sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_240 = io;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150,
                 "when parsing config file ",configFileYAML);
  plVar5 = (long *)std::__cxx11::string::append((char *)local_150);
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  psVar6 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_210.field_2._M_allocated_capacity = *psVar6;
    local_210.field_2._8_8_ = plVar5[3];
  }
  else {
    local_210.field_2._M_allocated_capacity = *psVar6;
    local_210._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_210._M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  pNVar1 = (Node *)(local_150 + 0x10);
  if ((Node *)local_150._0_8_ != pNVar1) {
    operator_delete((void *)local_150._0_8_);
  }
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  pcVar2 = (configFileContents->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b0,pcVar2,pcVar2 + configFileContents->_M_string_length);
  _Var9._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_190;
  YAML::Load((Node *)_Var9._M_pi,&local_1b0);
  if ((local_190.m_isValid != true) ||
     ((local_190.m_pNode != (node *)0x0 &&
      ((((((local_190.m_pNode)->m_pRef).
          super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_pData).
        super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_isDefined
       == false)))) {
    local_150._0_8_ = pNVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"Helper","");
    local_1f0._0_8_ = (pointer)((long)&local_1f0 + 0x10U);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"adiosYAML","");
    local_278._M_p = (pointer)&local_268;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"ParseConfigYAML","");
    std::operator+(&local_50,"parser error in file ",configFileYAML);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
    p_Var7 = (_Hash_node_base *)(plVar5 + 2);
    if ((_Hash_node_base *)*plVar5 == p_Var7) {
      local_60._M_nxt = p_Var7->_M_nxt;
      sStack_58 = plVar5[3];
      local_70._M_nxt = &local_60;
    }
    else {
      local_60._M_nxt = p_Var7->_M_nxt;
      local_70._M_nxt = (_Hash_node_base *)*plVar5;
    }
    local_68 = plVar5[1];
    *plVar5 = (long)p_Var7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_70,(ulong)local_210._M_dataplus._M_p);
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_238.field_2._M_allocated_capacity = *psVar6;
      local_238.field_2._8_8_ = plVar5[3];
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    }
    else {
      local_238.field_2._M_allocated_capacity = *psVar6;
      local_238._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_238._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    Throw<std::invalid_argument>
              ((string *)local_150,(string *)&local_1f0,(string *)&local_278,&local_238,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p);
    }
    if (local_70._M_nxt != &local_60) {
      operator_delete(local_70._M_nxt);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_p != &local_268) {
      operator_delete(local_278._M_p);
    }
    if ((pointer)local_1f0._0_8_ != (pointer)((long)&local_1f0 + 0x10U)) {
      operator_delete((void *)local_1f0._0_8_);
    }
    _Var9._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._0_8_;
    if ((Node *)local_150._0_8_ != pNVar1) {
      operator_delete((void *)local_150._0_8_);
    }
  }
  pnVar3 = local_190.m_pNode;
  if (local_190.m_isValid == false) {
    local_278._M_p = (pointer)((ulong)local_278._M_p._4_4_ << 0x20);
    SStack_270._M_current = (node **)0x0;
    local_268._M_allocated_capacity = 0;
    local_268._8_8_ = 0;
    local_258 = (element_type *)0x0;
    local_250._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (local_190.m_pNode == (node *)0x0) {
      local_278._M_p = (pointer)((ulong)local_278._M_p._4_4_ << 0x20);
      SStack_270._M_current = (node **)0x0;
      local_268._M_allocated_capacity = 0;
      local_268._8_8_ = 0;
      local_258 = (element_type *)0x0;
      local_250._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      YAML::detail::node_data::begin
                ((node_iterator *)local_150,
                 ((((local_190.m_pNode)->m_pRef).
                   super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 m_pData).super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
      _Var9._M_pi = local_190.m_pMemory.
                    super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      if ((Node *)local_190.m_pMemory.
                  super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi == (Node *)0x0) {
        local_268._M_allocated_capacity = local_150._16_8_;
        local_268._8_8_ = apnStack_138[0];
        local_278._M_p = (pointer)local_150._0_8_;
        SStack_270._M_current = (node **)local_150._8_8_;
        local_258 = local_190.m_pMemory.
                    super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
        local_250._M_pi =
             local_190.m_pMemory.
             super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi;
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&(((string *)
                    &(local_190.m_pMemory.
                      super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count)->_M_dataplus)._M_p =
               *(int *)&(((string *)
                         &(local_190.m_pMemory.
                           super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi)->_M_use_count)->_M_dataplus)._M_p + 1;
          UNLOCK();
        }
        else {
          *(int *)&(((string *)
                    &(local_190.m_pMemory.
                      super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count)->_M_dataplus)._M_p =
               *(int *)&(((string *)
                         &(local_190.m_pMemory.
                           super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi)->_M_use_count)->_M_dataplus)._M_p + 1;
        }
        local_268._M_allocated_capacity = local_150._16_8_;
        local_268._8_8_ = apnStack_138[0];
        local_278._M_p = (pointer)local_150._0_8_;
        SStack_270._M_current = (node **)local_150._8_8_;
        local_258 = local_190.m_pMemory.
                    super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
        local_250._M_pi =
             local_190.m_pMemory.
             super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi;
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&(((string *)
                    &(local_190.m_pMemory.
                      super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count)->_M_dataplus)._M_p =
               *(int *)&(((string *)
                         &(local_190.m_pMemory.
                           super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi)->_M_use_count)->_M_dataplus)._M_p + 1;
          UNLOCK();
        }
        else {
          *(int *)&(((string *)
                    &(local_190.m_pMemory.
                      super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count)->_M_dataplus)._M_p =
               *(int *)&(((string *)
                         &(local_190.m_pMemory.
                           super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi)->_M_use_count)->_M_dataplus)._M_p + 1;
        }
      }
    }
    if ((Node *)_Var9._M_pi != (Node *)0x0 && pnVar3 != (node *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var9._M_pi);
    }
  }
  local_218 = &local_b8;
  do {
    pnVar3 = local_190.m_pNode;
    if (local_190.m_isValid == true) {
      if (local_190.m_pNode == (node *)0x0) {
        vVar8 = NoneType;
        _Var9._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(Node *)0x0;
        sVar10 = 0;
        ppnVar11 = (node **)0x0;
      }
      else {
        YAML::detail::node_data::end
                  ((node_iterator *)local_150,
                   ((((local_190.m_pNode)->m_pRef).
                     super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->m_pData).
                   super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        vVar8 = (value)local_150._0_8_;
        _Var9._M_pi = local_190.m_pMemory.
                      super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        sVar10 = local_150._16_8_;
        ppnVar11 = (node **)local_150._8_8_;
        if ((Node *)local_190.m_pMemory.
                    super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (Node *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&(((string *)
                      &(local_190.m_pMemory.
                        super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count)->_M_dataplus)._M_p =
                 *(int *)&(((string *)
                           &(local_190.m_pMemory.
                             super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi)->_M_use_count)->_M_dataplus)._M_p + 1;
            UNLOCK();
          }
          else {
            *(int *)&(((string *)
                      &(local_190.m_pMemory.
                        super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count)->_M_dataplus)._M_p =
                 *(int *)&(((string *)
                           &(local_190.m_pMemory.
                             super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi)->_M_use_count)->_M_dataplus)._M_p + 1;
          }
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&(((string *)
                      &(local_190.m_pMemory.
                        super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count)->_M_dataplus)._M_p =
                 *(int *)&(((string *)
                           &(local_190.m_pMemory.
                             super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi)->_M_use_count)->_M_dataplus)._M_p + 1;
            UNLOCK();
          }
          else {
            *(int *)&(((string *)
                      &(local_190.m_pMemory.
                        super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count)->_M_dataplus)._M_p =
                 *(int *)&(((string *)
                           &(local_190.m_pMemory.
                             super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi)->_M_use_count)->_M_dataplus)._M_p + 1;
          }
        }
      }
      if ((Node *)_Var9._M_pi != (Node *)0x0 && pnVar3 != (node *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var9._M_pi);
      }
    }
    else {
      sVar10 = 0;
      _Var9._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      vVar8 = NoneType;
      ppnVar11 = (node **)0x0;
    }
    if ((value)local_278._M_p == vVar8) {
      if ((value)local_278._M_p == Map) {
        bVar12 = local_268._M_allocated_capacity == sVar10;
      }
      else {
        bVar12 = true;
        if ((value)local_278._M_p == Sequence) {
          bVar12 = SStack_270._M_current == ppnVar11;
        }
      }
    }
    else {
      bVar12 = false;
    }
    if ((Node *)_Var9._M_pi != (Node *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var9._M_pi);
    }
    if (bVar12) goto LAB_00421d89;
    local_90._0_8_ = (_Base_ptr)(local_90 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"IO","");
    YAML::detail::iterator_base<const_YAML::detail::iterator_value>::operator*
              ((value_type *)local_150,
               (iterator_base<const_YAML::detail::iterator_value> *)&local_278);
    anon_unknown_0::YAMLNode
              (&local_1f0,(string *)local_90,(Node *)local_150,&local_210,false,Scalar);
    if (local_b8._M_right != (_Base_ptr)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_right);
    }
    if (local_c8 != local_218) {
      operator_delete(local_c8);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._M_allocated_capacity !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._M_allocated_capacity);
    }
    if (local_108 != local_f8) {
      operator_delete(local_108);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120._M_nxt !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120._M_nxt);
    }
    if ((node **)local_150._8_8_ != apnStack_138) {
      operator_delete((void *)local_150._8_8_);
    }
    if ((_Base_ptr)local_90._0_8_ != (_Base_ptr)(local_90 + 0x10)) {
      operator_delete((void *)local_90._0_8_);
    }
    if (((string)local_1f0.m_isValid == (string)0x1) &&
       ((local_1f0.m_pNode == (node *)0x0 ||
        ((((((local_1f0.m_pNode)->m_pRef).
            super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_pData)
          .super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         m_isDefined == true)))) {
      local_150._0_8_ = &local_1f0;
      YAML::
      as_if<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
      operator()(&local_238,
                 (as_if<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                  *)local_150);
      if (local_238._M_string_length == (local_240->m_Name)._M_string_length) {
        if (local_238._M_string_length == 0) {
          bVar12 = true;
        }
        else {
          iVar4 = bcmp(local_238._M_dataplus._M_p,(local_240->m_Name)._M_dataplus._M_p,
                       local_238._M_string_length);
          bVar12 = iVar4 == 0;
        }
      }
      else {
        bVar12 = false;
      }
      if (bVar12) {
        adios_00 = (ADIOS *)local_150;
        YAML::detail::iterator_base<const_YAML::detail::iterator_value>::operator*
                  ((value_type *)local_150,
                   (iterator_base<const_YAML::detail::iterator_value> *)&local_278);
        IOYAML(adios_00,(Node *)local_150,local_240,&local_210);
        if (local_b8._M_right != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_right);
        }
        if (local_c8 != local_218) {
          operator_delete(local_c8);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._M_allocated_capacity !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._M_allocated_capacity)
          ;
        }
        if (local_108 != local_f8) {
          operator_delete(local_108);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120._M_nxt !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120._M_nxt);
        }
        if ((node **)local_150._8_8_ != apnStack_138) {
          operator_delete((void *)local_150._8_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p);
        }
        if (bVar12) {
          if (local_1f0.m_pMemory.
              super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_1f0.m_pMemory.
                       super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_1f0.m_invalidKey._M_dataplus._M_p != (pointer)((long)&local_1f0 + 0x18U)) {
            operator_delete(local_1f0.m_invalidKey._M_dataplus._M_p);
          }
LAB_00421d89:
          if ((Node *)local_250._M_pi != (Node *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_250._M_pi);
          }
          if ((Node *)local_190.m_pMemory.
                      super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi != (Node *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_190.m_pMemory.
                       super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190.m_invalidKey._M_dataplus._M_p != &local_190.m_invalidKey.field_2) {
            operator_delete(local_190.m_invalidKey._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
            operator_delete(local_1b0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != &local_210.field_2) {
            operator_delete(local_210._M_dataplus._M_p);
          }
          return;
        }
      }
      else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
    }
    if (local_1f0.m_pMemory.
        super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1f0.m_pMemory.
                 super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_1f0.m_invalidKey._M_dataplus._M_p != (pointer)((long)&local_1f0 + 0x18U)) {
      operator_delete(local_1f0.m_invalidKey._M_dataplus._M_p);
    }
    YAML::detail::node_iterator_base<YAML::detail::node>::operator++
              ((node_iterator_base<YAML::detail::node> *)&local_278);
  } while( true );
}

Assistant:

void ParseConfigYAMLIO(core::ADIOS &adios, const std::string &configFileYAML,
                       const std::string &configFileContents, core::IO &io)
{
    const std::string hint =
        "when parsing config file " + configFileYAML + " in call to ADIOS constructor";

    // the following copy is needed because YAML::Load modifies configFileContents
    const std::string configFileContentsCopy = configFileContents;
    const YAML::Node document = YAML::Load(configFileContentsCopy);

    if (!document)
    {
        helper::Throw<std::invalid_argument>(
            "Helper", "adiosYAML", "ParseConfigYAML",
            "parser error in file " + configFileYAML +
                " invalid format check with any YAML editor if format is "
                "ill-formed, " +
                hint);
    }

    for (auto itNode = document.begin(); itNode != document.end(); ++itNode)
    {
        const YAML::Node ioScalar =
            YAMLNode("IO", *itNode, hint, isNotMandatory, YAML::NodeType::Scalar);
        if (ioScalar)
        {
            const std::string ioName = ioScalar.as<std::string>();
            if (ioName == io.m_Name)
            {
                IOYAML(adios, *itNode, io, hint);
                return;
            }
        }
    }
}